

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O0

void __thiscall QFbVtHandler::QFbVtHandler(QFbVtHandler *this,QObject *parent)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  QSocketNotifier *this_00;
  QObject *in_RSI;
  QFbVtHandler *in_RDI;
  long in_FS_OFFSET;
  sigaction sa;
  undefined1 in_stack_ffffffffffffff0f;
  undefined4 in_stack_ffffffffffffff10;
  Type TVar4;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 enable;
  ContextType *in_stack_ffffffffffffff58;
  _union_1457 in_stack_ffffffffffffff60;
  offset_in_QSocketNotifier_to_subr in_stack_ffffffffffffff80;
  ConnectionType in_stack_ffffffffffffffa0;
  
  enable = (undefined1)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(&in_RDI->super_QObject,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_001a8500;
  in_RDI->m_tty = -1;
  in_RDI->m_signalNotifier = (QSocketNotifier *)0x0;
  iVar2 = isatty(0);
  if (iVar2 != 0) {
    in_RDI->m_tty = 0;
  }
  iVar2 = socketpair(1,1,0,in_RDI->m_sigFd);
  if (iVar2 == 0) {
    TVar4 = Read;
    vth = in_RDI;
    setTTYCursor((bool)enable);
    setKeyboardEnabled((QFbVtHandler *)CONCAT44(TVar4,in_stack_ffffffffffffff10),
                       (bool)in_stack_ffffffffffffff0f);
    this_00 = (QSocketNotifier *)operator_new(0x10);
    QSocketNotifier::QSocketNotifier(this_00,(long)in_RDI->m_sigFd[1],TVar4,&in_RDI->super_QObject);
    in_RDI->m_signalNotifier = this_00;
    QObject::
    connect<void(QSocketNotifier::*)(QSocketDescriptor,QSocketNotifier::Type,QSocketNotifier::QPrivateSignal),void(QFbVtHandler::*)()>
              ((Object *)in_stack_ffffffffffffff60.sa_handler,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff58,(offset_in_QFbVtHandler_to_subr *)0x0,
               in_stack_ffffffffffffffa0);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffff58);
    iVar2 = qEnvironmentVariableIntValue("QT_QPA_NO_SIGNAL_HANDLER",(bool *)0x0);
    if (iVar2 == 0) {
      memset(&stack0xffffffffffffff60,0xaa,0x98);
      sigemptyset((sigset_t *)&stack0xffffffffffffff68);
      sigaction(2,(sigaction *)&stack0xffffffffffffff60,(sigaction *)0x0);
      sigaction(0x14,(sigaction *)&stack0xffffffffffffff60,(sigaction *)0x0);
      sigaction(0x12,(sigaction *)&stack0xffffffffffffff60,(sigaction *)0x0);
      sigaction(0xf,(sigaction *)&stack0xffffffffffffff60,(sigaction *)0x0);
    }
  }
  else {
    piVar3 = __errno_location();
    qErrnoWarning(*piVar3,"QFbVtHandler: socketpair() failed");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFbVtHandler::QFbVtHandler(QObject *parent)
    : QObject(parent),
      m_tty(-1),
      m_signalNotifier(0)
{
#ifdef VTH_ENABLED
    if (isatty(0))
        m_tty = 0;

    if (::socketpair(AF_UNIX, SOCK_STREAM, 0, m_sigFd)) {
        qErrnoWarning(errno, "QFbVtHandler: socketpair() failed");
        return;
    }

    vth = this;
    setTTYCursor(false);
    setKeyboardEnabled(false);

    m_signalNotifier = new QSocketNotifier(m_sigFd[1], QSocketNotifier::Read, this);
    connect(m_signalNotifier, &QSocketNotifier::activated, this, &QFbVtHandler::handleSignal);

    if (!qEnvironmentVariableIntValue("QT_QPA_NO_SIGNAL_HANDLER")) {
        struct sigaction sa;
        sa.sa_flags = 0;
        sa.sa_handler = signalHandler;
        sigemptyset(&sa.sa_mask);
        sigaction(SIGINT, &sa, 0); // Ctrl+C
        sigaction(SIGTSTP, &sa, 0); // Ctrl+Z
        sigaction(SIGCONT, &sa, 0);
        sigaction(SIGTERM, &sa, 0); // default signal used by kill
    }
#endif
}